

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CategoricalMappingValidator.cpp
# Opt level: O0

Result * CoreML::validate<(MLModelType)606>(Result *__return_storage_ptr__,Model *format)

{
  allocator<CoreML::Specification::FeatureType::TypeCase> *paVar1;
  initializer_list<CoreML::Specification::FeatureType::TypeCase> __l;
  initializer_list<CoreML::Specification::FeatureType::TypeCase> __l_00;
  bool bVar2;
  int32 modelVersion;
  TypeCase TVar3;
  TypeCase TVar4;
  ModelDescription *from;
  CategoricalMapping *pCVar5;
  CoreML *pCVar6;
  FeatureDescription *pFVar7;
  FeatureType *pFVar8;
  SequenceFeatureType *pSVar9;
  char *pcVar10;
  vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  *in_R8;
  allocator local_339;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_338;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_318;
  string local_2f8;
  string local_2d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  string local_268;
  TypeCase local_240 [2];
  TypeCase *local_238;
  size_type local_230;
  vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  local_228;
  Result local_210;
  TypeCase local_1e0 [2];
  TypeCase *local_1d8;
  size_type local_1d0;
  vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  local_1c8;
  Result local_1b0;
  string local_180;
  string local_158;
  string local_130;
  TypeCase local_108;
  TypeCase requiredOutputSeqType;
  TypeCase requiredInputSeqType;
  TypeCase requiredOutputType;
  TypeCase requiredInputType;
  ValueOnUnknownCase defval_type;
  MappingTypeCase mapping_type;
  undefined1 local_b8 [48];
  ModelDescription interface;
  Model *format_local;
  
  interface._112_8_ = format;
  from = Specification::Model::description(format);
  Specification::ModelDescription::ModelDescription((ModelDescription *)(local_b8 + 0x28),from);
  Result::Result((Result *)local_b8);
  modelVersion = Specification::Model::specificationversion((Model *)interface._112_8_);
  validateModelDescription
            ((Result *)&mapping_type,(ModelDescription *)(local_b8 + 0x28),modelVersion);
  Result::operator=((Result *)local_b8,(Result *)&mapping_type);
  Result::~Result((Result *)&mapping_type);
  bVar2 = Result::good((Result *)local_b8);
  if (bVar2) {
    pCVar5 = Specification::Model::categoricalmapping((Model *)interface._112_8_);
    requiredInputType = Specification::CategoricalMapping::MappingType_case(pCVar5);
    pCVar5 = Specification::Model::categoricalmapping((Model *)interface._112_8_);
    requiredOutputType = Specification::CategoricalMapping::ValueOnUnknown_case(pCVar5);
    if (requiredInputType == TYPE_NOT_SET) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_180,"Mapping not set.",
                 (allocator *)(local_1b0.m_message._M_storage._M_storage + 7));
      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_180);
      std::__cxx11::string::~string((string *)&local_180);
      std::allocator<char>::~allocator
                ((allocator<char> *)(local_1b0.m_message._M_storage._M_storage + 7));
    }
    else {
      if (requiredInputType == kInt64Type) {
        if (requiredOutputType == kStrValue) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&local_130,
                     "ValueOnUnknown set to string value while mapping produces int64.",
                     (allocator *)(local_158._M_storage._M_storage + 7));
          Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_130);
          std::__cxx11::string::~string((string *)&local_130);
          std::allocator<char>::~allocator((allocator<char> *)(local_158._M_storage._M_storage + 7))
          ;
          goto LAB_0036207e;
        }
        requiredInputSeqType = kStringType;
        requiredOutputSeqType = kInt64Type;
        local_108 = kStringType;
        local_130._M_storage._M_storage[4] = '\x01';
        local_130._M_storage._M_storage[5] = '\0';
        local_130._M_storage._M_storage[6] = '\0';
        local_130._M_storage._M_storage[7] = '\0';
      }
      else if (requiredInputType == kDoubleType) {
        if (requiredOutputType == kInt64Value) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&local_158,
                     "ValueOnUnknown set to Int64 value while mapping produces string.",
                     (allocator *)(local_180._M_storage._M_storage + 7));
          Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_158);
          std::__cxx11::string::~string((string *)&local_158);
          std::allocator<char>::~allocator((allocator<char> *)(local_180._M_storage._M_storage + 7))
          ;
          goto LAB_0036207e;
        }
        requiredOutputSeqType = kStringType;
        requiredInputSeqType = kInt64Type;
        local_130._M_storage._M_storage[4] = '\x03';
        local_130._M_storage._M_storage[5] = '\0';
        local_130._M_storage._M_storage[6] = '\0';
        local_130._M_storage._M_storage[7] = '\0';
        local_108 = kInt64Type;
      }
      pCVar6 = (CoreML *)
               Specification::ModelDescription::input((ModelDescription *)(local_b8 + 0x28));
      local_1e0[0] = requiredInputSeqType;
      local_1e0[1] = 7;
      local_1d8 = local_1e0;
      local_1d0 = 2;
      paVar1 = (allocator<CoreML::Specification::FeatureType::TypeCase> *)
               (local_210.m_message._M_storage._M_storage + 7);
      std::allocator<CoreML::Specification::FeatureType::TypeCase>::allocator(paVar1);
      __l_00._M_len = local_1d0;
      __l_00._M_array = local_1d8;
      std::
      vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
      ::vector(&local_1c8,__l_00,paVar1);
      validateDescriptionsContainFeatureWithTypes<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>>
                (&local_1b0,pCVar6,
                 (RepeatedPtrField<CoreML::Specification::FeatureDescription> *)0x1,(int)&local_1c8,
                 in_R8);
      Result::operator=((Result *)local_b8,&local_1b0);
      Result::~Result(&local_1b0);
      std::
      vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
      ::~vector(&local_1c8);
      std::allocator<CoreML::Specification::FeatureType::TypeCase>::~allocator
                ((allocator<CoreML::Specification::FeatureType::TypeCase> *)
                 (local_210.m_message._M_storage._M_storage + 7));
      bVar2 = Result::good((Result *)local_b8);
      if (bVar2) {
        pCVar6 = (CoreML *)
                 Specification::ModelDescription::output((ModelDescription *)(local_b8 + 0x28));
        local_240[0] = requiredOutputSeqType;
        local_240[1] = 7;
        local_238 = local_240;
        local_230 = 2;
        paVar1 = (allocator<CoreML::Specification::FeatureType::TypeCase> *)
                 (local_268._M_storage._M_storage + 7);
        std::allocator<CoreML::Specification::FeatureType::TypeCase>::allocator(paVar1);
        __l._M_len = local_230;
        __l._M_array = local_238;
        std::
        vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
        ::vector(&local_228,__l,paVar1);
        validateDescriptionsContainFeatureWithTypes<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>>
                  (&local_210,pCVar6,
                   (RepeatedPtrField<CoreML::Specification::FeatureDescription> *)0x1,
                   (int)&local_228,in_R8);
        Result::operator=((Result *)local_b8,&local_210);
        Result::~Result(&local_210);
        std::
        vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
        ::~vector(&local_228);
        std::allocator<CoreML::Specification::FeatureType::TypeCase>::~allocator
                  ((allocator<CoreML::Specification::FeatureType::TypeCase> *)
                   (local_268._M_storage._M_storage + 7));
        bVar2 = Result::good((Result *)local_b8);
        if (bVar2) {
          pFVar7 = Specification::ModelDescription::input((ModelDescription *)(local_b8 + 0x28),0);
          pFVar8 = Specification::FeatureDescription::type(pFVar7);
          TVar3 = Specification::FeatureType::Type_case(pFVar8);
          if (TVar3 == kSequenceType) {
            pFVar7 = Specification::ModelDescription::input((ModelDescription *)(local_b8 + 0x28),0)
            ;
            pFVar8 = Specification::FeatureDescription::type(pFVar7);
            pSVar9 = Specification::FeatureType::sequencetype(pFVar8);
            TVar4 = Specification::SequenceFeatureType::Type_case(pSVar9);
            if (TVar4 != local_108) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string
                        ((string *)&local_2a8,"Input sequence type does not match input type ",
                         (allocator *)(local_2d0._M_storage._M_storage + 7));
              pcVar10 = ::MLFeatureTypeType_Name(requiredInputSeqType);
              std::operator+(&local_288,&local_2a8,pcVar10);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &local_268,&local_288,"of categorical mapping.");
              Result::Result(__return_storage_ptr__,UNSUPPORTED_FEATURE_TYPE_FOR_MODEL_TYPE,
                             &local_268);
              std::__cxx11::string::~string((string *)&local_268);
              std::__cxx11::string::~string((string *)&local_288);
              std::__cxx11::string::~string((string *)&local_2a8);
              std::allocator<char>::~allocator
                        ((allocator<char> *)(local_2d0._M_storage._M_storage + 7));
              goto LAB_0036207e;
            }
            pFVar7 = Specification::ModelDescription::output
                               ((ModelDescription *)(local_b8 + 0x28),0);
            pFVar8 = Specification::FeatureDescription::type(pFVar7);
            TVar3 = Specification::FeatureType::Type_case(pFVar8);
            if (TVar3 != kSequenceType) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string
                        ((string *)&local_2d0,
                         "Output of a sequence categorical mapping must be a sequence",
                         (allocator *)(local_2f8._M_storage._M_storage + 7));
              Result::Result(__return_storage_ptr__,UNSUPPORTED_FEATURE_TYPE_FOR_MODEL_TYPE,
                             &local_2d0);
              std::__cxx11::string::~string((string *)&local_2d0);
              std::allocator<char>::~allocator
                        ((allocator<char> *)(local_2f8._M_storage._M_storage + 7));
              goto LAB_0036207e;
            }
            pFVar7 = Specification::ModelDescription::output
                               ((ModelDescription *)(local_b8 + 0x28),0);
            pFVar8 = Specification::FeatureDescription::type(pFVar7);
            pSVar9 = Specification::FeatureType::sequencetype(pFVar8);
            TVar4 = Specification::SequenceFeatureType::Type_case(pSVar9);
            if (TVar4 != local_130._M_storage._M_storage._4_4_) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string
                        ((string *)&local_338,"Output sequence type does not match input type ",
                         &local_339);
              pcVar10 = ::MLFeatureTypeType_Name(requiredOutputSeqType);
              std::operator+(&local_318,&local_338,pcVar10);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &local_2f8,&local_318,"of categorical mapping.");
              Result::Result(__return_storage_ptr__,UNSUPPORTED_FEATURE_TYPE_FOR_MODEL_TYPE,
                             &local_2f8);
              std::__cxx11::string::~string((string *)&local_2f8);
              std::__cxx11::string::~string((string *)&local_318);
              std::__cxx11::string::~string((string *)&local_338);
              std::allocator<char>::~allocator((allocator<char> *)&local_339);
              goto LAB_0036207e;
            }
          }
          Result::Result(__return_storage_ptr__,(Result *)local_b8);
        }
        else {
          Result::Result(__return_storage_ptr__,(Result *)local_b8);
        }
      }
      else {
        Result::Result(__return_storage_ptr__,(Result *)local_b8);
      }
    }
  }
  else {
    Result::Result(__return_storage_ptr__,(Result *)local_b8);
  }
LAB_0036207e:
  defval_type = 1;
  Result::~Result((Result *)local_b8);
  Specification::ModelDescription::~ModelDescription((ModelDescription *)(local_b8 + 0x28));
  return __return_storage_ptr__;
}

Assistant:

Result validate<MLModelType_categoricalMapping>(const Specification::Model& format) {
        auto interface = format.description();

        Result result;

        // Validate its a MLModel type.
        result = validateModelDescription(interface, format.specificationversion());
        if (!result.good()) {
            return result;
        }
        
        auto mapping_type = format.categoricalmapping().MappingType_case();
        auto defval_type = format.categoricalmapping().ValueOnUnknown_case();
        Specification::FeatureType::TypeCase requiredInputType;
        Specification::FeatureType::TypeCase requiredOutputType;
        Specification::SequenceFeatureType::TypeCase requiredInputSeqType;
        Specification::SequenceFeatureType::TypeCase requiredOutputSeqType;

        switch(mapping_type) {
            case Specification::CategoricalMapping::MappingTypeCase::kStringToInt64Map:
                
                if(defval_type == Specification::CategoricalMapping::ValueOnUnknownCase::kStrValue) {
                    return Result(ResultType::INVALID_MODEL_PARAMETERS,
                                  "ValueOnUnknown set to string value while mapping produces int64.");
                }
                requiredInputType = Specification::FeatureType::kStringType;
                requiredOutputType = Specification::FeatureType::kInt64Type;
                requiredInputSeqType = Specification::SequenceFeatureType::kStringType;
                requiredOutputSeqType = Specification::SequenceFeatureType::kInt64Type;
                
                break;
                
            case Specification::CategoricalMapping::MappingTypeCase::kInt64ToStringMap:
                if(defval_type == Specification::CategoricalMapping::ValueOnUnknownCase::kInt64Value) {
                    return Result(ResultType::INVALID_MODEL_PARAMETERS,
                                  "ValueOnUnknown set to Int64 value while mapping produces string.");
                }
                requiredOutputType = Specification::FeatureType::kStringType;
                requiredInputType = Specification::FeatureType::kInt64Type;
                requiredOutputSeqType = Specification::SequenceFeatureType::kStringType;
                requiredInputSeqType = Specification::SequenceFeatureType::kInt64Type;
                
                break;
                
            case Specification::CategoricalMapping::MappingTypeCase::MAPPINGTYPE_NOT_SET:
                return Result(ResultType::INVALID_MODEL_PARAMETERS,
                              "Mapping not set.");
        }

        // Validate the inputs
        result = validateDescriptionsContainFeatureWithTypes(interface.input(), 1, {requiredInputType, Specification::FeatureType::kSequenceType});
        if (!result.good()) {
            return result;
        }
        
        // Validate the outputs
        result = validateDescriptionsContainFeatureWithTypes(interface.output(), 1, {requiredOutputType, Specification::FeatureType::kSequenceType});
        if (!result.good()) {
            return result;
        }

        // Check if the input was a sequence
        if (interface.input(0).type().Type_case() == Specification::FeatureType::kSequenceType) {

            // Make sure its the correct input type
            if (interface.input(0).type().sequencetype().Type_case() != requiredInputSeqType) {
                return Result(ResultType::UNSUPPORTED_FEATURE_TYPE_FOR_MODEL_TYPE,
                              std::string("Input sequence type does not match input type ") +
                              MLFeatureTypeType_Name(static_cast<MLFeatureTypeType>(requiredInputType)) +
                              "of categorical mapping.");
            }

            // Make sure the outupt is a sequence as well
            if (interface.output(0).type().Type_case() != Specification::FeatureType::kSequenceType) {
                return Result(ResultType::UNSUPPORTED_FEATURE_TYPE_FOR_MODEL_TYPE,
                              "Output of a sequence categorical mapping must be a sequence");
            }

            // Make sure the otuput is the correct type
            if (interface.output(0).type().sequencetype().Type_case() != requiredOutputSeqType) {
                return Result(ResultType::UNSUPPORTED_FEATURE_TYPE_FOR_MODEL_TYPE,
                              std::string("Output sequence type does not match input type ") +
                              MLFeatureTypeType_Name(static_cast<MLFeatureTypeType>(requiredOutputType)) +
                              "of categorical mapping.");
            }
        }


        // Validate the parameters
        return result;
    }